

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

Vector3<pbrt::Interval<float>_> * __thiscall
pbrt::Tuple3<pbrt::Vector3,pbrt::Interval<float>>::operator*
          (Tuple3<pbrt::Vector3,_pbrt::Interval<float>_> *this,Interval<float> s)

{
  long in_RSI;
  Interval<float> in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  Interval<float> *unaff_retaddr;
  Interval<float> in_stack_00000008;
  Vector3<pbrt::Interval<float>_> *this_00;
  Interval<float> y;
  Interval<float> x;
  Interval<float> local_8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  local_8 = (Interval<float>)vmovlpd_avx(in_ZMM0._0_16_);
  this_00 = (Vector3<pbrt::Interval<float>_> *)&stack0xfffffffffffffff8;
  y = in_RDI;
  auVar1._0_8_ = Interval<float>::operator*<float>(unaff_retaddr,in_stack_00000008);
  auVar1._8_56_ = extraout_var;
  vmovlpd_avx(auVar1._0_16_);
  auVar2._0_8_ = Interval<float>::operator*<float>(unaff_retaddr,in_stack_00000008);
  auVar2._8_56_ = extraout_var_00;
  vmovlpd_avx(auVar2._0_16_);
  x = *(Interval<float> *)(in_RSI + 0x10);
  auVar3._0_8_ = Interval<float>::operator*<float>(unaff_retaddr,in_stack_00000008);
  auVar3._8_56_ = extraout_var_01;
  vmovlpd_avx(auVar3._0_16_);
  Vector3<pbrt::Interval<float>_>::Vector3(this_00,x,y,in_RDI);
  return (Vector3<pbrt::Interval<float>_> *)y;
}

Assistant:

PBRT_CPU_GPU auto operator*(U s) const -> Child<decltype(T{} * U{})> {
        return {s * x, s * y, s * z};
    }